

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_meshlink.c
# Opt level: O3

REF_STATUS ref_meshlink_infer_orientation(REF_GRID ref_grid)

{
  REF_MPI ref_mpi;
  REF_CELL ref_cell;
  REF_GEOM pRVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  uint uVar4;
  REF_STATUS RVar5;
  REF_DBL *pRVar6;
  undefined8 uVar7;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  REF_DBL min_normdev;
  REF_INT positive;
  REF_INT negative;
  REF_DBL max_normdev;
  REF_DBL normdev;
  REF_INT max_id;
  REF_INT min_id;
  REF_INT nodes [27];
  double local_e0;
  int local_d8;
  int local_d4;
  double local_d0;
  double local_c8;
  int local_bc;
  REF_GEOM local_b8;
  int local_ac;
  REF_INT local_a8 [30];
  long lVar14;
  
  ref_mpi = ref_grid->mpi;
  ref_cell = ref_grid->cell[3];
  pRVar1 = ref_grid->geom;
  uVar4 = ref_cell_id_range(ref_cell,ref_mpi,&local_ac,&local_bc);
  iVar10 = local_bc;
  if (uVar4 == 0) {
    uVar9 = (ulong)local_ac;
    if ((long)uVar9 < 1) {
      pcVar8 = "expected min_id greater then zero";
      uVar7 = 0x3c7;
    }
    else {
      lVar11 = (long)local_bc;
      pRVar1->nface = local_bc;
      if (-1 < lVar11) {
        pRVar6 = (REF_DBL *)malloc(lVar11 * 8);
        pRVar1->uv_area_sign = pRVar6;
        auVar3 = _DAT_00210060;
        local_b8 = pRVar1;
        if (pRVar6 == (REF_DBL *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c"
                 ,0x3c9,"ref_meshlink_infer_orientation",
                 "malloc ref_geom->uv_area_sign of REF_DBL NULL");
          return 2;
        }
        if (iVar10 != 0) {
          lVar11 = lVar11 + -1;
          auVar12._8_4_ = (int)lVar11;
          auVar12._0_8_ = lVar11;
          auVar12._12_4_ = (int)((ulong)lVar11 >> 0x20);
          lVar11 = 0;
          auVar12 = auVar12 ^ _DAT_00210060;
          auVar13 = _DAT_00210050;
          do {
            auVar15 = auVar13 ^ auVar3;
            if ((bool)(~(auVar15._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar15._0_4_ ||
                        auVar12._4_4_ < auVar15._4_4_) & 1)) {
              *(undefined8 *)((long)pRVar6 + lVar11) = 0x3ff0000000000000;
            }
            if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
                auVar15._12_4_ <= auVar12._12_4_) {
              *(undefined8 *)((long)pRVar6 + lVar11 + 8) = 0x3ff0000000000000;
            }
            lVar14 = auVar13._8_8_;
            auVar13._0_8_ = auVar13._0_8_ + 2;
            auVar13._8_8_ = lVar14 + 2;
            lVar11 = lVar11 + 0x10;
          } while ((ulong)(iVar10 + 1U >> 1) << 4 != lVar11);
        }
        if (iVar10 < local_ac) {
          return 0;
        }
        while( true ) {
          local_e0 = 2.0;
          local_d0 = -2.0;
          local_d4 = 0;
          local_d8 = 0;
          if (0 < ref_cell->max) {
            iVar10 = 0;
            do {
              RVar5 = ref_cell_nodes(ref_cell,iVar10,local_a8);
              if ((RVar5 == 0) && (local_a8[ref_cell->node_per] == (int)uVar9)) {
                uVar4 = ref_geom_tri_norm_deviation(ref_grid,local_a8,&local_c8);
                if (uVar4 != 0) {
                  uVar9 = (ulong)uVar4;
                  pcVar8 = "norm dev";
                  uVar7 = 0x3d2;
                  goto LAB_0016b35e;
                }
                if (local_c8 <= local_e0) {
                  local_e0 = local_c8;
                }
                if (local_d0 <= local_c8) {
                  local_d0 = local_c8;
                }
                if (0.0 <= local_c8) {
                  local_d8 = local_d8 + 1;
                }
                else {
                  local_d4 = local_d4 + 1;
                }
              }
              iVar10 = iVar10 + 1;
            } while (iVar10 < ref_cell->max);
          }
          local_c8 = local_e0;
          uVar4 = ref_mpi_min(ref_mpi,&local_c8,&local_e0,3);
          if (uVar4 != 0) break;
          uVar4 = ref_mpi_bcast(ref_mpi,&local_e0,1,3);
          if (uVar4 != 0) {
            uVar9 = (ulong)uVar4;
            pcVar8 = "min";
            uVar7 = 0x3dd;
            goto LAB_0016b35e;
          }
          local_c8 = local_d0;
          uVar4 = ref_mpi_max(ref_mpi,&local_c8,&local_d0,3);
          if (uVar4 != 0) {
            uVar9 = (ulong)uVar4;
            pcVar8 = "mpi max";
            uVar7 = 0x3df;
            goto LAB_0016b35e;
          }
          uVar4 = ref_mpi_bcast(ref_mpi,&local_d0,1,3);
          if (uVar4 != 0) {
            uVar9 = (ulong)uVar4;
            pcVar8 = "max";
            uVar7 = 0x3e0;
            goto LAB_0016b35e;
          }
          uVar4 = ref_mpi_allsum(ref_mpi,&local_d8,1,1);
          if (uVar4 != 0) {
            uVar9 = (ulong)uVar4;
            pcVar8 = "mpi sum";
            uVar7 = 0x3e1;
            goto LAB_0016b35e;
          }
          uVar4 = ref_mpi_allsum(ref_mpi,&local_d4,1,1);
          if (uVar4 != 0) {
            uVar9 = (ulong)uVar4;
            pcVar8 = "mpi sum";
            uVar7 = 0x3e2;
            goto LAB_0016b35e;
          }
          if ((local_e0 <= 1.5) || (-1.5 <= local_d0)) {
            if (local_d8 < local_d4) {
              local_b8->uv_area_sign[uVar9 - 1] = -1.0;
            }
            if (ref_mpi->id == 0) {
              printf("gref %3d orientation%6.2f inferred from %6.2f %d %d %6.2f \n",
                     local_b8->uv_area_sign[uVar9 - 1],local_e0,local_d0,uVar9 & 0xffffffff);
            }
          }
          else {
            local_b8->uv_area_sign[uVar9 - 1] = 0.0;
          }
          bVar2 = (long)local_bc <= (long)uVar9;
          uVar9 = uVar9 + 1;
          if (bVar2) {
            return 0;
          }
        }
        uVar9 = (ulong)uVar4;
        pcVar8 = "mpi max";
        uVar7 = 0x3dc;
        goto LAB_0016b35e;
      }
      pcVar8 = "malloc ref_geom->uv_area_sign of REF_DBL negative";
      uVar7 = 0x3c9;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
           uVar7,"ref_meshlink_infer_orientation",pcVar8);
    RVar5 = 1;
  }
  else {
    uVar9 = (ulong)uVar4;
    pcVar8 = "id range";
    uVar7 = 0x3c6;
LAB_0016b35e:
    RVar5 = (REF_STATUS)uVar9;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_meshlink.c",
           uVar7,"ref_meshlink_infer_orientation",uVar9,pcVar8);
  }
  return RVar5;
}

Assistant:

REF_FCN REF_STATUS ref_meshlink_infer_orientation(REF_GRID ref_grid) {
  REF_MPI ref_mpi = ref_grid_mpi(ref_grid);
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT min_id, max_id, id;
  REF_DBL normdev, min_normdev, max_normdev;
  REF_INT negative, positive;
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  RSS(ref_cell_id_range(ref_cell, ref_mpi, &min_id, &max_id), "id range");
  RAS(min_id > 0, "expected min_id greater then zero");
  ref_geom->nface = max_id;
  ref_malloc_init(ref_geom->uv_area_sign, ref_geom->nface, REF_DBL, 1.0);

  for (id = min_id; id <= max_id; id++) {
    min_normdev = 2.0;
    max_normdev = -2.0;
    negative = 0;
    positive = 0;
    each_ref_cell_valid_cell_with_nodes(ref_cell, cell, nodes) {
      if (id != nodes[ref_cell_id_index(ref_cell)]) continue;
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "norm dev");
      min_normdev = MIN(min_normdev, normdev);
      max_normdev = MAX(max_normdev, normdev);
      if (normdev < 0.0) {
        negative++;
      } else {
        positive++;
      }
    }
    normdev = min_normdev;
    RSS(ref_mpi_min(ref_mpi, &normdev, &min_normdev, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &min_normdev, 1, REF_DBL_TYPE), "min");
    normdev = max_normdev;
    RSS(ref_mpi_max(ref_mpi, &normdev, &max_normdev, REF_DBL_TYPE), "mpi max");
    RSS(ref_mpi_bcast(ref_mpi, &max_normdev, 1, REF_DBL_TYPE), "max");
    RSS(ref_mpi_allsum(ref_mpi, &positive, 1, REF_INT_TYPE), "mpi sum");
    RSS(ref_mpi_allsum(ref_mpi, &negative, 1, REF_INT_TYPE), "mpi sum");
    if (min_normdev > 1.5 && max_normdev < -1.5) {
      ref_geom->uv_area_sign[id - 1] = 0.0;
    } else {
      if (positive < negative) ref_geom->uv_area_sign[id - 1] = -1.0;
      if (ref_mpi_once(ref_mpi))
        printf("gref %3d orientation%6.2f inferred from %6.2f %d %d %6.2f \n",
               id, ref_geom->uv_area_sign[id - 1], min_normdev, negative,
               positive, max_normdev);
    }
  }

  return REF_SUCCESS;
}